

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall
Session::setAsymmetricCryptoOp(Session *this,AsymmetricAlgorithm *inAsymmetricCryptoOp)

{
  CryptoFactory *pCVar1;
  
  if (this->asymmetricCryptoOp != (AsymmetricAlgorithm *)0x0) {
    setPublicKey(this,(PublicKey *)0x0);
    setPrivateKey(this,(PrivateKey *)0x0);
    pCVar1 = CryptoFactory::i();
    (*pCVar1->_vptr_CryptoFactory[3])(pCVar1,this->asymmetricCryptoOp);
  }
  this->asymmetricCryptoOp = inAsymmetricCryptoOp;
  return;
}

Assistant:

void Session::setAsymmetricCryptoOp(AsymmetricAlgorithm *inAsymmetricCryptoOp)
{
	if (asymmetricCryptoOp != NULL)
	{
		setPublicKey(NULL);
		setPrivateKey(NULL);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(asymmetricCryptoOp);
	}

	asymmetricCryptoOp = inAsymmetricCryptoOp;
}